

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O1

BufferView * __thiscall PEFile::createSectionView(PEFile *this,size_t secId)

{
  SectionHdrWrapper *sec;
  BufferView *pBVar1;
  WatchedLocker lock;
  
  sec = (SectionHdrWrapper *)0x0;
  WatchedLocker::WatchedLocker(&lock,&this->m_peMutex,false,"createSectionView");
  if (this->sects != (SectHdrsWrapper *)0x0) {
    sec = SectHdrsWrapper::_getSecHdr(this->sects,secId);
  }
  if (sec == (SectionHdrWrapper *)0x0) {
    pBVar1 = (BufferView *)0x0;
    Logger::append(D_WARNING,"No such section");
  }
  else {
    pBVar1 = _createSectionView(this,sec);
  }
  WatchedLocker::~WatchedLocker(&lock);
  return pBVar1;
}

Assistant:

BufferView* PEFile::createSectionView(size_t secId)
{
    WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
    SectionHdrWrapper *sec = this->_getSecHdr(secId);
    if (!sec) {
        Logger::append(Logger::D_WARNING, "No such section");
        return NULL;
    }
    return _createSectionView(sec);
}